

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb.cpp
# Opt level: O2

void __thiscall RGB::Free(RGB *this)

{
  if (this->r_ != (uint8_t *)0x0) {
    operator_delete__(this->r_);
  }
  if (this->g_ != (uint8_t *)0x0) {
    operator_delete__(this->g_);
  }
  if (this->b_ != (uint8_t *)0x0) {
    operator_delete__(this->b_);
    return;
  }
  return;
}

Assistant:

void RGB::Free(){
  delete [] r_;
  delete [] g_;
  delete [] b_;
}